

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fftlib.c
# Opt level: O3

void rffts1(float *ioptr,long M,long Rows,float *Utbl,short *BRLow)

{
  bool bVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  undefined8 uVar7;
  undefined1 auVar8 [32];
  long StageCnt;
  byte bVar9;
  byte bVar10;
  float *pfVar11;
  float *p0r;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  ushort uVar15;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined1 auVar44 [64];
  undefined1 auVar45 [64];
  undefined1 auVar46 [64];
  undefined1 auVar47 [64];
  undefined1 auVar48 [64];
  undefined1 auVar49 [64];
  undefined1 auVar50 [64];
  undefined1 auVar51 [64];
  undefined1 auVar52 [64];
  undefined1 auVar53 [64];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  ulong uVar16;
  undefined1 auVar43 [64];
  
  switch(M) {
  case 0:
    break;
  case 1:
    if (0 < Rows) {
      pfVar11 = ioptr + 1;
      uVar13 = Rows + 1;
      do {
        fVar2 = pfVar11[-1];
        uVar13 = uVar13 - 1;
        pfVar11[-1] = *pfVar11 + fVar2;
        *pfVar11 = fVar2 - *pfVar11;
        pfVar11 = pfVar11 + (1L << (M & 0x3fU));
      } while (1 < uVar13);
    }
    break;
  case 2:
    if (0 < Rows) {
      pfVar11 = ioptr + 3;
      uVar13 = Rows + 1;
      do {
        fVar2 = pfVar11[-3];
        fVar3 = pfVar11[-2];
        uVar13 = uVar13 - 1;
        fVar4 = pfVar11[-1] + fVar2;
        fVar5 = *pfVar11 + fVar3;
        pfVar11[-3] = fVar5 + fVar4;
        pfVar11[-2] = fVar4 - fVar5;
        pfVar11[-1] = fVar2 - pfVar11[-1];
        *pfVar11 = *pfVar11 - fVar3;
        pfVar11 = pfVar11 + (1L << (M & 0x3fU));
      } while (1 < uVar13);
    }
    break;
  case 3:
    if (0 < Rows) {
      pfVar11 = ioptr + 7;
      uVar13 = Rows + 1;
      do {
        uVar13 = uVar13 - 1;
        fVar2 = pfVar11[-1] + pfVar11[-5];
        fVar3 = *pfVar11 + pfVar11[-4];
        uVar14 = *(ulong *)(pfVar11 + -7);
        auVar21._8_8_ = 0;
        auVar21._0_8_ = uVar14;
        uVar16 = *(ulong *)(pfVar11 + -3);
        auVar22._8_8_ = 0;
        auVar22._0_8_ = uVar16;
        fVar6 = (pfVar11[-4] - *pfVar11) * -1.4142135;
        auVar23._0_4_ = (float)uVar16 + (float)uVar14;
        auVar23._4_4_ = (float)(uVar16 >> 0x20) + (float)(uVar14 >> 0x20);
        auVar23._8_8_ = 0;
        auVar20 = vsubps_avx(auVar21,auVar22);
        auVar18 = vmovshdup_avx(auVar23);
        fVar4 = auVar23._0_4_ + fVar2;
        fVar5 = auVar18._0_4_ + fVar3;
        auVar24._0_4_ = auVar20._0_4_ * 2.0;
        auVar24._4_4_ = auVar20._4_4_ * 1.4142135;
        auVar24._8_4_ = auVar20._8_4_ * 0.0;
        auVar24._12_4_ = auVar20._12_4_ * 0.0;
        pfVar11[-3] = auVar23._0_4_ - fVar2;
        auVar19 = vmovshdup_avx(auVar24);
        auVar17 = vhaddps_avx(auVar24,auVar24);
        pfVar11[-2] = fVar3 - auVar18._0_4_;
        auVar21 = ZEXT416((uint)(pfVar11[-5] - pfVar11[-1]));
        auVar18 = vfnmsub231ss_fma(auVar19,auVar21,SUB6416(ZEXT464(0x40000000),0));
        pfVar11[-7] = fVar5 + fVar4;
        pfVar11[-6] = fVar4 - fVar5;
        auVar22 = ZEXT416((uint)(auVar17._0_4_ + fVar6));
        auVar19 = vfmsub213ss_fma(auVar20,SUB6416(ZEXT464(0x40800000),0),auVar22);
        auVar17 = ZEXT416((uint)(fVar6 + auVar18._0_4_));
        auVar18 = vfmadd213ss_fma(auVar21,SUB6416(ZEXT464(0x40800000),0),auVar17);
        auVar17 = vinsertps_avx(auVar22,auVar17,0x10);
        auVar20._0_4_ = auVar17._0_4_ * 0.5;
        auVar20._4_4_ = auVar17._4_4_ * 0.5;
        auVar20._8_4_ = auVar17._8_4_ * 0.5;
        auVar20._12_4_ = auVar17._12_4_ * 0.5;
        uVar7 = vmovlps_avx(auVar20);
        *(undefined8 *)(pfVar11 + -5) = uVar7;
        pfVar11[-1] = auVar19._0_4_ * 0.5;
        *pfVar11 = auVar18._0_4_ * 0.5;
        pfVar11 = pfVar11 + (1L << (M & 0x3fU));
      } while (1 < uVar13);
    }
    break;
  case 4:
    if (0 < Rows) {
      pfVar11 = ioptr + 0xf;
      uVar13 = Rows + 1;
      do {
        uVar13 = uVar13 - 1;
        auVar17 = vaddss_avx512f(ZEXT416((uint)pfVar11[-5]),ZEXT416((uint)pfVar11[-0xd]));
        auVar18 = vaddss_avx512f(ZEXT416((uint)pfVar11[-4]),ZEXT416((uint)pfVar11[-0xc]));
        auVar19 = vaddss_avx512f(ZEXT416((uint)pfVar11[-1]),ZEXT416((uint)pfVar11[-9]));
        auVar20 = vsubss_avx512f(ZEXT416((uint)pfVar11[-9]),ZEXT416((uint)pfVar11[-1]));
        auVar21 = vaddss_avx512f(ZEXT416((uint)*pfVar11),ZEXT416((uint)pfVar11[-8]));
        auVar22 = vsubss_avx512f(ZEXT416((uint)pfVar11[-8]),ZEXT416((uint)*pfVar11));
        auVar26 = ZEXT416((uint)(pfVar11[-0xc] - pfVar11[-4]));
        auVar23 = vaddss_avx512f(auVar20,auVar26);
        auVar24 = vsubss_avx512f(auVar18,auVar21);
        auVar18 = vaddss_avx512f(auVar21,auVar18);
        auVar25 = ZEXT416((uint)(pfVar11[-0xd] - pfVar11[-5]));
        auVar21 = vsubss_avx512f(auVar25,auVar22);
        auVar20 = vsubss_avx512f(auVar26,auVar20);
        auVar22 = vaddss_avx512f(auVar22,auVar25);
        auVar25 = vaddss_avx512f(auVar19,auVar17);
        auVar19 = vsubss_avx512f(auVar17,auVar19);
        auVar17 = SUB6416(ZEXT464(0x3f3504f3),0);
        auVar22 = vmulss_avx512f(auVar22,auVar17);
        auVar20 = vmulss_avx512f(auVar20,ZEXT416(0xbf3504f3));
        auVar21 = vmulss_avx512f(auVar21,auVar17);
        auVar28._8_8_ = 0;
        auVar28._0_8_ = *(ulong *)(pfVar11 + -0xb);
        auVar29._8_8_ = 0;
        auVar29._0_8_ = *(ulong *)(pfVar11 + -0xf);
        auVar30._8_8_ = 0;
        auVar30._0_8_ = *(ulong *)(pfVar11 + -7);
        auVar23 = vmulss_avx512f(auVar23,auVar17);
        auVar24 = vmulss_avx512f(auVar24,SUB6416(ZEXT464(0xbfb504f3),0));
        auVar17._8_8_ = 0;
        auVar17._0_8_ = *(ulong *)(pfVar11 + -3);
        auVar26 = vsubps_avx512vl(auVar28,auVar17);
        auVar27 = vaddps_avx512vl(auVar30,auVar29);
        auVar28 = vaddps_avx512vl(auVar17,auVar28);
        auVar17 = vsubps_avx(auVar29,auVar30);
        auVar29 = vaddps_avx512vl(auVar28,auVar27);
        auVar30 = vmovshdup_avx512vl(auVar26);
        auVar27 = vsubps_avx512vl(auVar27,auVar28);
        auVar28 = vmovshdup_avx512vl(auVar17);
        auVar31 = vsubss_avx512f(auVar17,auVar30);
        auVar17 = vaddss_avx512f(auVar30,auVar17);
        auVar30 = vaddss_avx512f(auVar26,auVar28);
        auVar26 = vsubss_avx512f(auVar28,auVar26);
        auVar28 = vmovshdup_avx512vl(auVar29);
        auVar33._0_4_ = auVar27._0_4_ * 2.0;
        auVar33._4_4_ = auVar27._4_4_ * 1.4142135;
        auVar33._8_4_ = auVar27._8_4_ * 0.0;
        auVar33._12_4_ = auVar27._12_4_ * 0.0;
        auVar32 = vsubss_avx512f(auVar18,auVar28);
        auVar18 = vaddss_avx512f(auVar18,auVar28);
        auVar28 = vaddss_avx512f(auVar20,auVar17);
        auVar28 = vsubss_avx512f(auVar28,auVar22);
        auVar22 = vaddss_avx512f(auVar26,auVar22);
        pfVar11[-6] = auVar32._0_4_;
        auVar32 = vaddss_avx512f(auVar25,auVar29);
        auVar56._0_4_ = auVar25._0_4_;
        auVar56._4_4_ = auVar56._0_4_;
        auVar56._8_4_ = auVar56._0_4_;
        auVar56._12_4_ = auVar56._0_4_;
        auVar56._16_4_ = auVar56._0_4_;
        auVar56._20_4_ = auVar56._0_4_;
        auVar56._24_4_ = auVar56._0_4_;
        auVar56._28_4_ = auVar56._0_4_;
        auVar56 = vblendps_avx(ZEXT1632(auVar18),auVar56,0x80);
        auVar20 = vaddss_avx512f(auVar20,auVar22);
        auVar22 = vsubss_avx512f(auVar31,auVar23);
        auVar23 = vaddss_avx512f(auVar23,auVar30);
        auVar54 = SUB6416(ZEXT464(0x40000000),0);
        auVar25 = vfmsub213ss_avx512f(auVar17,auVar54,auVar28);
        auVar18 = vaddss_avx512f(auVar18,auVar32);
        auVar22 = vaddss_avx512f(auVar22,auVar21);
        auVar26 = vfmsub213ss_avx512f(auVar26,auVar54,auVar20);
        auVar21 = vaddss_avx512f(auVar23,auVar21);
        auVar23 = vmovshdup_avx512vl(auVar33);
        auVar17 = vhaddps_avx(auVar33,auVar33);
        pfVar11[-0xf] = auVar18._0_4_;
        auVar18 = vfnmsub231ss_avx512f(auVar23,auVar19,auVar54);
        auVar23 = vfmsub213ss_avx512f(auVar31,auVar54,auVar22);
        auVar30 = vfmsub213ss_avx512f(auVar30,auVar54,auVar21);
        auVar31 = vaddss_avx512f(auVar25,auVar22);
        auVar22 = vsubss_avx512f(auVar22,auVar25);
        auVar25 = vsubss_avx512f(auVar26,auVar21);
        auVar21 = vaddss_avx512f(auVar26,auVar21);
        auVar54 = SUB6416(ZEXT464(0x3f6c835e),0);
        auVar26 = vaddss_avx512f(auVar17,auVar24);
        auVar18 = vaddss_avx512f(auVar24,auVar18);
        auVar24 = vfmadd213ss_avx512f(auVar54,auVar21,auVar31);
        auVar55 = SUB6416(ZEXT464(0x3ec3ef15),0);
        auVar21 = vfmsub213ss_avx512f(auVar21,auVar55,auVar25);
        auVar25 = vaddss_avx512f(auVar25,auVar25);
        auVar33 = vaddss_avx512f(auVar23,auVar28);
        auVar23 = vsubss_avx512f(auVar28,auVar23);
        auVar28 = vsubss_avx512f(auVar30,auVar20);
        auVar20 = vaddss_avx512f(auVar30,auVar20);
        auVar17 = vfmsub213ss_fma(auVar27,SUB6416(ZEXT464(0x40800000),0),auVar26);
        auVar27 = vaddss_avx512f(auVar31,auVar31);
        auVar19 = vfmadd213ss_avx512f(auVar19,SUB6416(ZEXT464(0x40800000),0),auVar18);
        auVar30 = vfmadd213ss_avx512f(auVar54,auVar23,auVar33);
        auVar31 = vfmsub213ss_avx512f(auVar54,auVar20,auVar28);
        auVar33 = vaddss_avx512f(auVar33,auVar33);
        auVar28 = vaddss_avx512f(auVar28,auVar28);
        auVar24 = vfmadd231ss_avx512f(auVar24,auVar22,auVar55);
        auVar21 = vfmsub231ss_avx512f(auVar21,auVar54,auVar22);
        auVar20 = vfmadd231ss_avx512f(auVar30,auVar55,auVar20);
        auVar22 = vfmsub231ss_avx512f(auVar31,auVar55,auVar23);
        pfVar11[-3] = auVar17._0_4_ * 0.5;
        pfVar11[-2] = auVar19._0_4_ * 0.5;
        auVar17 = vshufps_avx512vl(auVar24,auVar21,0);
        auVar17 = vinsertps_avx(auVar17,auVar26,0x30);
        auVar18 = vinsertps_avx512f(auVar18,auVar20,0x10);
        auVar18 = vinsertps_avx512f(auVar18,auVar22,0x20);
        auVar19 = vunpcklps_avx512vl(auVar32,auVar29);
        auVar57._0_8_ = auVar19._0_8_;
        auVar57._8_8_ = auVar57._0_8_;
        auVar57._16_8_ = auVar57._0_8_;
        auVar57._24_8_ = auVar57._0_8_;
        auVar8._4_4_ = auVar17._4_4_ * 0.5;
        auVar8._0_4_ = auVar17._0_4_ * 0.5;
        auVar8._8_4_ = auVar17._8_4_ * 0.5;
        auVar8._12_4_ = auVar17._12_4_ * 0.5;
        auVar8._16_4_ = auVar18._0_4_ * 0.5;
        auVar8._20_4_ = auVar18._4_4_ * 0.5;
        auVar8._24_4_ = auVar18._8_4_ * 0.5;
        auVar8._28_4_ = auVar18._12_4_;
        auVar56 = vsubps_avx(auVar57,auVar56);
        auVar56 = vblendps_avx(auVar8,auVar56,0x81);
        auVar17 = vinsertps_avx512f(auVar20,auVar28,0x10);
        *(undefined1 (*) [32])(pfVar11 + -0xe) = auVar56;
        auVar18 = vinsertps_avx512f(auVar33,auVar22,0x10);
        auVar17 = vsubps_avx(auVar18,auVar17);
        auVar18 = vinsertps_avx512f(auVar24,auVar25,0x10);
        auVar19._0_4_ = auVar17._0_4_ * 0.5;
        auVar19._4_4_ = auVar17._4_4_ * 0.5;
        auVar19._8_4_ = auVar17._8_4_ * 0.5;
        auVar19._12_4_ = auVar17._12_4_ * 0.5;
        uVar7 = vmovlps_avx(auVar19);
        *(undefined8 *)(pfVar11 + -5) = uVar7;
        auVar17 = vinsertps_avx512f(auVar27,auVar21,0x10);
        auVar17 = vsubps_avx(auVar17,auVar18);
        auVar18._0_4_ = auVar17._0_4_ * 0.5;
        auVar18._4_4_ = auVar17._4_4_ * 0.5;
        auVar18._8_4_ = auVar17._8_4_ * 0.5;
        auVar18._12_4_ = auVar17._12_4_ * 0.5;
        uVar7 = vmovlps_avx(auVar18);
        *(undefined8 *)(pfVar11 + -1) = uVar7;
        pfVar11 = pfVar11 + (1L << (M & 0x3fU));
      } while (1 < uVar13);
    }
    break;
  default:
    if (0 < Rows) {
      uVar13 = M - 1;
      StageCnt = (M + -2) / 3;
      lVar12 = (M + -2) % 3;
      auVar34 = vpbroadcastq_avx512f();
      auVar34 = vmovdqu64_avx512f(auVar34);
      do {
        scbitrevR2(ioptr,uVar13,BRLow,0.5);
        uVar14 = 2;
        if (lVar12 == 1) {
          uVar14 = 4;
          if (2 < uVar13) {
            auVar35 = vmovdqu64_avx512f(auVar34);
            auVar36 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
            auVar37 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
            uVar14 = 0;
            pfVar11 = ioptr;
            do {
              auVar38 = vpbroadcastq_avx512f();
              uVar14 = uVar14 + 0x10;
              auVar39 = vporq_avx512f(auVar38,auVar36);
              auVar38 = vporq_avx512f(auVar38,auVar37);
              uVar7 = vpcmpuq_avx512f(auVar38,auVar35,2);
              bVar9 = (byte)uVar7;
              uVar7 = vpcmpuq_avx512f(auVar39,auVar35,2);
              bVar10 = (byte)uVar7;
              uVar15 = CONCAT11(bVar10,bVar9);
              uVar16 = (ulong)uVar15;
              auVar38 = vgatherdps_avx512f(*(undefined4 *)((long)pfVar11 + (long)Utbl));
              auVar39._4_4_ = (uint)((byte)(uVar15 >> 1) & 1) * auVar38._4_4_;
              auVar39._0_4_ = (uint)(bVar9 & 1) * auVar38._0_4_;
              auVar39._8_4_ = (uint)((byte)(uVar15 >> 2) & 1) * auVar38._8_4_;
              auVar39._12_4_ = (uint)((byte)(uVar15 >> 3) & 1) * auVar38._12_4_;
              auVar39._16_4_ = (uint)((byte)(uVar15 >> 4) & 1) * auVar38._16_4_;
              auVar39._20_4_ = (uint)((byte)(uVar15 >> 5) & 1) * auVar38._20_4_;
              auVar39._24_4_ = (uint)((byte)(uVar15 >> 6) & 1) * auVar38._24_4_;
              auVar39._28_4_ = (uint)((byte)(uVar15 >> 7) & 1) * auVar38._28_4_;
              auVar39._32_4_ = (uint)(bVar10 & 1) * auVar38._32_4_;
              auVar39._36_4_ = (uint)(bVar10 >> 1 & 1) * auVar38._36_4_;
              auVar39._40_4_ = (uint)(bVar10 >> 2 & 1) * auVar38._40_4_;
              auVar39._44_4_ = (uint)(bVar10 >> 3 & 1) * auVar38._44_4_;
              auVar39._48_4_ = (uint)(bVar10 >> 4 & 1) * auVar38._48_4_;
              auVar39._52_4_ = (uint)(bVar10 >> 5 & 1) * auVar38._52_4_;
              auVar39._56_4_ = (uint)(bVar10 >> 6 & 1) * auVar38._56_4_;
              auVar39._60_4_ = (uint)(bVar10 >> 7) * auVar38._60_4_;
              auVar38 = vgatherdps_avx512f(*(undefined4 *)((long)(pfVar11 + 4) + (long)Utbl));
              auVar42._4_4_ = (uint)((byte)(uVar15 >> 1) & 1) * auVar38._4_4_;
              auVar42._0_4_ = (uint)(bVar9 & 1) * auVar38._0_4_;
              auVar42._8_4_ = (uint)((byte)(uVar15 >> 2) & 1) * auVar38._8_4_;
              auVar42._12_4_ = (uint)((byte)(uVar15 >> 3) & 1) * auVar38._12_4_;
              auVar42._16_4_ = (uint)((byte)(uVar15 >> 4) & 1) * auVar38._16_4_;
              auVar42._20_4_ = (uint)((byte)(uVar15 >> 5) & 1) * auVar38._20_4_;
              auVar42._24_4_ = (uint)((byte)(uVar15 >> 6) & 1) * auVar38._24_4_;
              auVar42._28_4_ = (uint)((byte)(uVar15 >> 7) & 1) * auVar38._28_4_;
              auVar42._32_4_ = (uint)(bVar10 & 1) * auVar38._32_4_;
              auVar42._36_4_ = (uint)(bVar10 >> 1 & 1) * auVar38._36_4_;
              auVar42._40_4_ = (uint)(bVar10 >> 2 & 1) * auVar38._40_4_;
              auVar42._44_4_ = (uint)(bVar10 >> 3 & 1) * auVar38._44_4_;
              auVar42._48_4_ = (uint)(bVar10 >> 4 & 1) * auVar38._48_4_;
              auVar42._52_4_ = (uint)(bVar10 >> 5 & 1) * auVar38._52_4_;
              auVar42._56_4_ = (uint)(bVar10 >> 6 & 1) * auVar38._56_4_;
              auVar42._60_4_ = (uint)(bVar10 >> 7) * auVar38._60_4_;
              auVar38 = vgatherdps_avx512f(*(undefined4 *)((long)(pfVar11 + 1) + (long)Utbl));
              auVar44._4_4_ = (uint)((byte)(uVar15 >> 1) & 1) * auVar38._4_4_;
              auVar44._0_4_ = (uint)(bVar9 & 1) * auVar38._0_4_;
              auVar44._8_4_ = (uint)((byte)(uVar15 >> 2) & 1) * auVar38._8_4_;
              auVar44._12_4_ = (uint)((byte)(uVar15 >> 3) & 1) * auVar38._12_4_;
              auVar44._16_4_ = (uint)((byte)(uVar15 >> 4) & 1) * auVar38._16_4_;
              auVar44._20_4_ = (uint)((byte)(uVar15 >> 5) & 1) * auVar38._20_4_;
              auVar44._24_4_ = (uint)((byte)(uVar15 >> 6) & 1) * auVar38._24_4_;
              auVar44._28_4_ = (uint)((byte)(uVar15 >> 7) & 1) * auVar38._28_4_;
              auVar44._32_4_ = (uint)(bVar10 & 1) * auVar38._32_4_;
              auVar44._36_4_ = (uint)(bVar10 >> 1 & 1) * auVar38._36_4_;
              auVar44._40_4_ = (uint)(bVar10 >> 2 & 1) * auVar38._40_4_;
              auVar44._44_4_ = (uint)(bVar10 >> 3 & 1) * auVar38._44_4_;
              auVar44._48_4_ = (uint)(bVar10 >> 4 & 1) * auVar38._48_4_;
              auVar44._52_4_ = (uint)(bVar10 >> 5 & 1) * auVar38._52_4_;
              auVar44._56_4_ = (uint)(bVar10 >> 6 & 1) * auVar38._56_4_;
              auVar44._60_4_ = (uint)(bVar10 >> 7) * auVar38._60_4_;
              auVar38 = vgatherdps_avx512f(*(undefined4 *)((long)(pfVar11 + 5) + (long)Utbl));
              auVar45._4_4_ = (uint)((byte)(uVar15 >> 1) & 1) * auVar38._4_4_;
              auVar45._0_4_ = (uint)(bVar9 & 1) * auVar38._0_4_;
              auVar45._8_4_ = (uint)((byte)(uVar15 >> 2) & 1) * auVar38._8_4_;
              auVar45._12_4_ = (uint)((byte)(uVar15 >> 3) & 1) * auVar38._12_4_;
              auVar45._16_4_ = (uint)((byte)(uVar15 >> 4) & 1) * auVar38._16_4_;
              auVar45._20_4_ = (uint)((byte)(uVar15 >> 5) & 1) * auVar38._20_4_;
              auVar45._24_4_ = (uint)((byte)(uVar15 >> 6) & 1) * auVar38._24_4_;
              auVar45._28_4_ = (uint)((byte)(uVar15 >> 7) & 1) * auVar38._28_4_;
              auVar45._32_4_ = (uint)(bVar10 & 1) * auVar38._32_4_;
              auVar45._36_4_ = (uint)(bVar10 >> 1 & 1) * auVar38._36_4_;
              auVar45._40_4_ = (uint)(bVar10 >> 2 & 1) * auVar38._40_4_;
              auVar45._44_4_ = (uint)(bVar10 >> 3 & 1) * auVar38._44_4_;
              auVar45._48_4_ = (uint)(bVar10 >> 4 & 1) * auVar38._48_4_;
              auVar45._52_4_ = (uint)(bVar10 >> 5 & 1) * auVar38._52_4_;
              auVar45._56_4_ = (uint)(bVar10 >> 6 & 1) * auVar38._56_4_;
              auVar45._60_4_ = (uint)(bVar10 >> 7) * auVar38._60_4_;
              auVar38 = vgatherdps_avx512f(*(undefined4 *)((long)(pfVar11 + 8) + (long)Utbl));
              auVar53._4_4_ = (uint)((byte)(uVar15 >> 1) & 1) * auVar38._4_4_;
              auVar53._0_4_ = (uint)(bVar9 & 1) * auVar38._0_4_;
              auVar53._8_4_ = (uint)((byte)(uVar15 >> 2) & 1) * auVar38._8_4_;
              auVar53._12_4_ = (uint)((byte)(uVar15 >> 3) & 1) * auVar38._12_4_;
              auVar53._16_4_ = (uint)((byte)(uVar15 >> 4) & 1) * auVar38._16_4_;
              auVar53._20_4_ = (uint)((byte)(uVar15 >> 5) & 1) * auVar38._20_4_;
              auVar53._24_4_ = (uint)((byte)(uVar15 >> 6) & 1) * auVar38._24_4_;
              auVar53._28_4_ = (uint)((byte)(uVar15 >> 7) & 1) * auVar38._28_4_;
              auVar53._32_4_ = (uint)(bVar10 & 1) * auVar38._32_4_;
              auVar53._36_4_ = (uint)(bVar10 >> 1 & 1) * auVar38._36_4_;
              auVar53._40_4_ = (uint)(bVar10 >> 2 & 1) * auVar38._40_4_;
              auVar53._44_4_ = (uint)(bVar10 >> 3 & 1) * auVar38._44_4_;
              auVar53._48_4_ = (uint)(bVar10 >> 4 & 1) * auVar38._48_4_;
              auVar53._52_4_ = (uint)(bVar10 >> 5 & 1) * auVar38._52_4_;
              auVar53._56_4_ = (uint)(bVar10 >> 6 & 1) * auVar38._56_4_;
              auVar53._60_4_ = (uint)(bVar10 >> 7) * auVar38._60_4_;
              auVar38 = vgatherdps_avx512f(*(undefined4 *)((long)(pfVar11 + 0xc) + (long)Utbl));
              auVar40._4_4_ = (uint)((byte)(uVar15 >> 1) & 1) * auVar38._4_4_;
              auVar40._0_4_ = (uint)(bVar9 & 1) * auVar38._0_4_;
              auVar40._8_4_ = (uint)((byte)(uVar15 >> 2) & 1) * auVar38._8_4_;
              auVar40._12_4_ = (uint)((byte)(uVar15 >> 3) & 1) * auVar38._12_4_;
              auVar40._16_4_ = (uint)((byte)(uVar15 >> 4) & 1) * auVar38._16_4_;
              auVar40._20_4_ = (uint)((byte)(uVar15 >> 5) & 1) * auVar38._20_4_;
              auVar40._24_4_ = (uint)((byte)(uVar15 >> 6) & 1) * auVar38._24_4_;
              auVar40._28_4_ = (uint)((byte)(uVar15 >> 7) & 1) * auVar38._28_4_;
              auVar40._32_4_ = (uint)(bVar10 & 1) * auVar38._32_4_;
              auVar40._36_4_ = (uint)(bVar10 >> 1 & 1) * auVar38._36_4_;
              auVar40._40_4_ = (uint)(bVar10 >> 2 & 1) * auVar38._40_4_;
              auVar40._44_4_ = (uint)(bVar10 >> 3 & 1) * auVar38._44_4_;
              auVar40._48_4_ = (uint)(bVar10 >> 4 & 1) * auVar38._48_4_;
              auVar40._52_4_ = (uint)(bVar10 >> 5 & 1) * auVar38._52_4_;
              auVar40._56_4_ = (uint)(bVar10 >> 6 & 1) * auVar38._56_4_;
              auVar40._60_4_ = (uint)(bVar10 >> 7) * auVar38._60_4_;
              auVar38 = vgatherdps_avx512f(*(undefined4 *)((long)(pfVar11 + 9) + (long)Utbl));
              auVar41._4_4_ = (uint)((byte)(uVar15 >> 1) & 1) * auVar38._4_4_;
              auVar41._0_4_ = (uint)(bVar9 & 1) * auVar38._0_4_;
              auVar41._8_4_ = (uint)((byte)(uVar15 >> 2) & 1) * auVar38._8_4_;
              auVar41._12_4_ = (uint)((byte)(uVar15 >> 3) & 1) * auVar38._12_4_;
              auVar41._16_4_ = (uint)((byte)(uVar15 >> 4) & 1) * auVar38._16_4_;
              auVar41._20_4_ = (uint)((byte)(uVar15 >> 5) & 1) * auVar38._20_4_;
              auVar41._24_4_ = (uint)((byte)(uVar15 >> 6) & 1) * auVar38._24_4_;
              auVar41._28_4_ = (uint)((byte)(uVar15 >> 7) & 1) * auVar38._28_4_;
              auVar41._32_4_ = (uint)(bVar10 & 1) * auVar38._32_4_;
              auVar41._36_4_ = (uint)(bVar10 >> 1 & 1) * auVar38._36_4_;
              auVar41._40_4_ = (uint)(bVar10 >> 2 & 1) * auVar38._40_4_;
              auVar41._44_4_ = (uint)(bVar10 >> 3 & 1) * auVar38._44_4_;
              auVar41._48_4_ = (uint)(bVar10 >> 4 & 1) * auVar38._48_4_;
              auVar41._52_4_ = (uint)(bVar10 >> 5 & 1) * auVar38._52_4_;
              auVar41._56_4_ = (uint)(bVar10 >> 6 & 1) * auVar38._56_4_;
              auVar41._60_4_ = (uint)(bVar10 >> 7) * auVar38._60_4_;
              auVar38 = vaddps_avx512f(auVar42,auVar39);
              auVar39 = vsubps_avx512f(auVar39,auVar42);
              auVar42 = vgatherdps_avx512f(*(undefined4 *)((long)(pfVar11 + 0xd) + (long)Utbl));
              auVar43._4_4_ = (uint)((byte)(uVar15 >> 1) & 1) * auVar42._4_4_;
              auVar43._0_4_ = (uint)(bVar9 & 1) * auVar42._0_4_;
              auVar43._8_4_ = (uint)((byte)(uVar15 >> 2) & 1) * auVar42._8_4_;
              auVar43._12_4_ = (uint)((byte)(uVar15 >> 3) & 1) * auVar42._12_4_;
              auVar43._16_4_ = (uint)((byte)(uVar15 >> 4) & 1) * auVar42._16_4_;
              auVar43._20_4_ = (uint)((byte)(uVar15 >> 5) & 1) * auVar42._20_4_;
              auVar43._24_4_ = (uint)((byte)(uVar15 >> 6) & 1) * auVar42._24_4_;
              auVar43._28_4_ = (uint)((byte)(uVar15 >> 7) & 1) * auVar42._28_4_;
              auVar43._32_4_ = (uint)(bVar10 & 1) * auVar42._32_4_;
              auVar43._36_4_ = (uint)(bVar10 >> 1 & 1) * auVar42._36_4_;
              auVar43._40_4_ = (uint)(bVar10 >> 2 & 1) * auVar42._40_4_;
              auVar43._44_4_ = (uint)(bVar10 >> 3 & 1) * auVar42._44_4_;
              auVar43._48_4_ = (uint)(bVar10 >> 4 & 1) * auVar42._48_4_;
              auVar43._52_4_ = (uint)(bVar10 >> 5 & 1) * auVar42._52_4_;
              auVar43._56_4_ = (uint)(bVar10 >> 6 & 1) * auVar42._56_4_;
              auVar43._60_4_ = (uint)(bVar10 >> 7) * auVar42._60_4_;
              auVar42 = vaddps_avx512f(auVar45,auVar44);
              auVar44 = vsubps_avx512f(auVar44,auVar45);
              vscatterdps_avx512f(ZEXT864(pfVar11) + _DAT_001091c0,uVar16,auVar38);
              auVar38 = vaddps_avx512f(auVar40,auVar53);
              auVar45 = vsubps_avx512f(auVar53,auVar40);
              vscatterdps_avx512f(ZEXT864(pfVar11) + _DAT_00109200,uVar16,auVar42);
              vscatterdps_avx512f(ZEXT864(pfVar11) + ZEXT864(0x10) + _DAT_001091c0,uVar16,auVar39);
              auVar39 = vaddps_avx512f(auVar43,auVar41);
              auVar42 = vsubps_avx512f(auVar41,auVar43);
              vscatterdps_avx512f(ZEXT864(pfVar11) + ZEXT864(0x10) + _DAT_00109200,uVar16,auVar44);
              vscatterdps_avx512f(ZEXT864(pfVar11) + ZEXT864(0x20) + _DAT_001091c0,uVar16,auVar38);
              vscatterdps_avx512f(ZEXT864(pfVar11) + ZEXT864(0x20) + _DAT_00109200,uVar16,auVar39);
              vscatterdps_avx512f(ZEXT864(pfVar11) + ZEXT864(0x30) + _DAT_001091c0,uVar16,auVar45);
              vscatterdps_avx512f(ZEXT864(pfVar11) + ZEXT864(0x30) + _DAT_00109200,uVar16,auVar42);
              auVar38 = vgatherdps_avx512f(pfVar11[1]);
              auVar46._4_4_ = (uint)((byte)(uVar15 >> 1) & 1) * auVar38._4_4_;
              auVar46._0_4_ = (uint)(bVar9 & 1) * auVar38._0_4_;
              auVar46._8_4_ = (uint)((byte)(uVar15 >> 2) & 1) * auVar38._8_4_;
              auVar46._12_4_ = (uint)((byte)(uVar15 >> 3) & 1) * auVar38._12_4_;
              auVar46._16_4_ = (uint)((byte)(uVar15 >> 4) & 1) * auVar38._16_4_;
              auVar46._20_4_ = (uint)((byte)(uVar15 >> 5) & 1) * auVar38._20_4_;
              auVar46._24_4_ = (uint)((byte)(uVar15 >> 6) & 1) * auVar38._24_4_;
              auVar46._28_4_ = (uint)((byte)(uVar15 >> 7) & 1) * auVar38._28_4_;
              auVar46._32_4_ = (uint)(bVar10 & 1) * auVar38._32_4_;
              auVar46._36_4_ = (uint)(bVar10 >> 1 & 1) * auVar38._36_4_;
              auVar46._40_4_ = (uint)(bVar10 >> 2 & 1) * auVar38._40_4_;
              auVar46._44_4_ = (uint)(bVar10 >> 3 & 1) * auVar38._44_4_;
              auVar46._48_4_ = (uint)(bVar10 >> 4 & 1) * auVar38._48_4_;
              auVar46._52_4_ = (uint)(bVar10 >> 5 & 1) * auVar38._52_4_;
              auVar46._56_4_ = (uint)(bVar10 >> 6 & 1) * auVar38._56_4_;
              auVar46._60_4_ = (uint)(bVar10 >> 7) * auVar38._60_4_;
              auVar38 = vgatherdps_avx512f(*(undefined4 *)((long)pfVar11 * 2 + 0x10));
              auVar47._4_4_ = (uint)((byte)(uVar15 >> 1) & 1) * auVar38._4_4_;
              auVar47._0_4_ = (uint)(bVar9 & 1) * auVar38._0_4_;
              auVar47._8_4_ = (uint)((byte)(uVar15 >> 2) & 1) * auVar38._8_4_;
              auVar47._12_4_ = (uint)((byte)(uVar15 >> 3) & 1) * auVar38._12_4_;
              auVar47._16_4_ = (uint)((byte)(uVar15 >> 4) & 1) * auVar38._16_4_;
              auVar47._20_4_ = (uint)((byte)(uVar15 >> 5) & 1) * auVar38._20_4_;
              auVar47._24_4_ = (uint)((byte)(uVar15 >> 6) & 1) * auVar38._24_4_;
              auVar47._28_4_ = (uint)((byte)(uVar15 >> 7) & 1) * auVar38._28_4_;
              auVar47._32_4_ = (uint)(bVar10 & 1) * auVar38._32_4_;
              auVar47._36_4_ = (uint)(bVar10 >> 1 & 1) * auVar38._36_4_;
              auVar47._40_4_ = (uint)(bVar10 >> 2 & 1) * auVar38._40_4_;
              auVar47._44_4_ = (uint)(bVar10 >> 3 & 1) * auVar38._44_4_;
              auVar47._48_4_ = (uint)(bVar10 >> 4 & 1) * auVar38._48_4_;
              auVar47._52_4_ = (uint)(bVar10 >> 5 & 1) * auVar38._52_4_;
              auVar47._56_4_ = (uint)(bVar10 >> 6 & 1) * auVar38._56_4_;
              auVar47._60_4_ = (uint)(bVar10 >> 7) * auVar38._60_4_;
              auVar38 = vgatherdps_avx512f(*(undefined4 *)((long)pfVar11 * 2));
              auVar48._4_4_ = (uint)((byte)(uVar15 >> 1) & 1) * auVar38._4_4_;
              auVar48._0_4_ = (uint)(bVar9 & 1) * auVar38._0_4_;
              auVar48._8_4_ = (uint)((byte)(uVar15 >> 2) & 1) * auVar38._8_4_;
              auVar48._12_4_ = (uint)((byte)(uVar15 >> 3) & 1) * auVar38._12_4_;
              auVar48._16_4_ = (uint)((byte)(uVar15 >> 4) & 1) * auVar38._16_4_;
              auVar48._20_4_ = (uint)((byte)(uVar15 >> 5) & 1) * auVar38._20_4_;
              auVar48._24_4_ = (uint)((byte)(uVar15 >> 6) & 1) * auVar38._24_4_;
              auVar48._28_4_ = (uint)((byte)(uVar15 >> 7) & 1) * auVar38._28_4_;
              auVar48._32_4_ = (uint)(bVar10 & 1) * auVar38._32_4_;
              auVar48._36_4_ = (uint)(bVar10 >> 1 & 1) * auVar38._36_4_;
              auVar48._40_4_ = (uint)(bVar10 >> 2 & 1) * auVar38._40_4_;
              auVar48._44_4_ = (uint)(bVar10 >> 3 & 1) * auVar38._44_4_;
              auVar48._48_4_ = (uint)(bVar10 >> 4 & 1) * auVar38._48_4_;
              auVar48._52_4_ = (uint)(bVar10 >> 5 & 1) * auVar38._52_4_;
              auVar48._56_4_ = (uint)(bVar10 >> 6 & 1) * auVar38._56_4_;
              auVar48._60_4_ = (uint)(bVar10 >> 7) * auVar38._60_4_;
              auVar38 = vgatherdps_avx512f(pfVar11[5]);
              auVar49._4_4_ = (uint)((byte)(uVar15 >> 1) & 1) * auVar38._4_4_;
              auVar49._0_4_ = (uint)(bVar9 & 1) * auVar38._0_4_;
              auVar49._8_4_ = (uint)((byte)(uVar15 >> 2) & 1) * auVar38._8_4_;
              auVar49._12_4_ = (uint)((byte)(uVar15 >> 3) & 1) * auVar38._12_4_;
              auVar49._16_4_ = (uint)((byte)(uVar15 >> 4) & 1) * auVar38._16_4_;
              auVar49._20_4_ = (uint)((byte)(uVar15 >> 5) & 1) * auVar38._20_4_;
              auVar49._24_4_ = (uint)((byte)(uVar15 >> 6) & 1) * auVar38._24_4_;
              auVar49._28_4_ = (uint)((byte)(uVar15 >> 7) & 1) * auVar38._28_4_;
              auVar49._32_4_ = (uint)(bVar10 & 1) * auVar38._32_4_;
              auVar49._36_4_ = (uint)(bVar10 >> 1 & 1) * auVar38._36_4_;
              auVar49._40_4_ = (uint)(bVar10 >> 2 & 1) * auVar38._40_4_;
              auVar49._44_4_ = (uint)(bVar10 >> 3 & 1) * auVar38._44_4_;
              auVar49._48_4_ = (uint)(bVar10 >> 4 & 1) * auVar38._48_4_;
              auVar49._52_4_ = (uint)(bVar10 >> 5 & 1) * auVar38._52_4_;
              auVar49._56_4_ = (uint)(bVar10 >> 6 & 1) * auVar38._56_4_;
              auVar49._60_4_ = (uint)(bVar10 >> 7) * auVar38._60_4_;
              auVar39 = vgatherdps_avx512f(pfVar11[9]);
              auVar38._4_4_ = (uint)((byte)(uVar15 >> 1) & 1) * auVar39._4_4_;
              auVar38._0_4_ = (uint)(bVar9 & 1) * auVar39._0_4_;
              auVar38._8_4_ = (uint)((byte)(uVar15 >> 2) & 1) * auVar39._8_4_;
              auVar38._12_4_ = (uint)((byte)(uVar15 >> 3) & 1) * auVar39._12_4_;
              auVar38._16_4_ = (uint)((byte)(uVar15 >> 4) & 1) * auVar39._16_4_;
              auVar38._20_4_ = (uint)((byte)(uVar15 >> 5) & 1) * auVar39._20_4_;
              auVar38._24_4_ = (uint)((byte)(uVar15 >> 6) & 1) * auVar39._24_4_;
              auVar38._28_4_ = (uint)((byte)(uVar15 >> 7) & 1) * auVar39._28_4_;
              auVar38._32_4_ = (uint)(bVar10 & 1) * auVar39._32_4_;
              auVar38._36_4_ = (uint)(bVar10 >> 1 & 1) * auVar39._36_4_;
              auVar38._40_4_ = (uint)(bVar10 >> 2 & 1) * auVar39._40_4_;
              auVar38._44_4_ = (uint)(bVar10 >> 3 & 1) * auVar39._44_4_;
              auVar38._48_4_ = (uint)(bVar10 >> 4 & 1) * auVar39._48_4_;
              auVar38._52_4_ = (uint)(bVar10 >> 5 & 1) * auVar39._52_4_;
              auVar38._56_4_ = (uint)(bVar10 >> 6 & 1) * auVar39._56_4_;
              auVar38._60_4_ = (uint)(bVar10 >> 7) * auVar39._60_4_;
              auVar39 = vgatherdps_avx512f(*(undefined4 *)((long)pfVar11 * 2 + 0x30));
              auVar50._4_4_ = (uint)((byte)(uVar15 >> 1) & 1) * auVar39._4_4_;
              auVar50._0_4_ = (uint)(bVar9 & 1) * auVar39._0_4_;
              auVar50._8_4_ = (uint)((byte)(uVar15 >> 2) & 1) * auVar39._8_4_;
              auVar50._12_4_ = (uint)((byte)(uVar15 >> 3) & 1) * auVar39._12_4_;
              auVar50._16_4_ = (uint)((byte)(uVar15 >> 4) & 1) * auVar39._16_4_;
              auVar50._20_4_ = (uint)((byte)(uVar15 >> 5) & 1) * auVar39._20_4_;
              auVar50._24_4_ = (uint)((byte)(uVar15 >> 6) & 1) * auVar39._24_4_;
              auVar50._28_4_ = (uint)((byte)(uVar15 >> 7) & 1) * auVar39._28_4_;
              auVar50._32_4_ = (uint)(bVar10 & 1) * auVar39._32_4_;
              auVar50._36_4_ = (uint)(bVar10 >> 1 & 1) * auVar39._36_4_;
              auVar50._40_4_ = (uint)(bVar10 >> 2 & 1) * auVar39._40_4_;
              auVar50._44_4_ = (uint)(bVar10 >> 3 & 1) * auVar39._44_4_;
              auVar50._48_4_ = (uint)(bVar10 >> 4 & 1) * auVar39._48_4_;
              auVar50._52_4_ = (uint)(bVar10 >> 5 & 1) * auVar39._52_4_;
              auVar50._56_4_ = (uint)(bVar10 >> 6 & 1) * auVar39._56_4_;
              auVar50._60_4_ = (uint)(bVar10 >> 7) * auVar39._60_4_;
              auVar39 = vgatherdps_avx512f(*(undefined4 *)((long)pfVar11 * 2 + 0x20));
              auVar51._4_4_ = (uint)((byte)(uVar15 >> 1) & 1) * auVar39._4_4_;
              auVar51._0_4_ = (uint)(bVar9 & 1) * auVar39._0_4_;
              auVar51._8_4_ = (uint)((byte)(uVar15 >> 2) & 1) * auVar39._8_4_;
              auVar51._12_4_ = (uint)((byte)(uVar15 >> 3) & 1) * auVar39._12_4_;
              auVar51._16_4_ = (uint)((byte)(uVar15 >> 4) & 1) * auVar39._16_4_;
              auVar51._20_4_ = (uint)((byte)(uVar15 >> 5) & 1) * auVar39._20_4_;
              auVar51._24_4_ = (uint)((byte)(uVar15 >> 6) & 1) * auVar39._24_4_;
              auVar51._28_4_ = (uint)((byte)(uVar15 >> 7) & 1) * auVar39._28_4_;
              auVar51._32_4_ = (uint)(bVar10 & 1) * auVar39._32_4_;
              auVar51._36_4_ = (uint)(bVar10 >> 1 & 1) * auVar39._36_4_;
              auVar51._40_4_ = (uint)(bVar10 >> 2 & 1) * auVar39._40_4_;
              auVar51._44_4_ = (uint)(bVar10 >> 3 & 1) * auVar39._44_4_;
              auVar51._48_4_ = (uint)(bVar10 >> 4 & 1) * auVar39._48_4_;
              auVar51._52_4_ = (uint)(bVar10 >> 5 & 1) * auVar39._52_4_;
              auVar51._56_4_ = (uint)(bVar10 >> 6 & 1) * auVar39._56_4_;
              auVar51._60_4_ = (uint)(bVar10 >> 7) * auVar39._60_4_;
              auVar39 = vaddps_avx512f(auVar47,auVar46);
              auVar42 = vsubps_avx512f(auVar46,auVar47);
              auVar44 = vgatherdps_avx512f(pfVar11[0xd]);
              auVar52._4_4_ = (uint)((byte)(uVar15 >> 1) & 1) * auVar44._4_4_;
              auVar52._0_4_ = (uint)(bVar9 & 1) * auVar44._0_4_;
              auVar52._8_4_ = (uint)((byte)(uVar15 >> 2) & 1) * auVar44._8_4_;
              auVar52._12_4_ = (uint)((byte)(uVar15 >> 3) & 1) * auVar44._12_4_;
              auVar52._16_4_ = (uint)((byte)(uVar15 >> 4) & 1) * auVar44._16_4_;
              auVar52._20_4_ = (uint)((byte)(uVar15 >> 5) & 1) * auVar44._20_4_;
              auVar52._24_4_ = (uint)((byte)(uVar15 >> 6) & 1) * auVar44._24_4_;
              auVar52._28_4_ = (uint)((byte)(uVar15 >> 7) & 1) * auVar44._28_4_;
              auVar52._32_4_ = (uint)(bVar10 & 1) * auVar44._32_4_;
              auVar52._36_4_ = (uint)(bVar10 >> 1 & 1) * auVar44._36_4_;
              auVar52._40_4_ = (uint)(bVar10 >> 2 & 1) * auVar44._40_4_;
              auVar52._44_4_ = (uint)(bVar10 >> 3 & 1) * auVar44._44_4_;
              auVar52._48_4_ = (uint)(bVar10 >> 4 & 1) * auVar44._48_4_;
              auVar52._52_4_ = (uint)(bVar10 >> 5 & 1) * auVar44._52_4_;
              auVar52._56_4_ = (uint)(bVar10 >> 6 & 1) * auVar44._56_4_;
              auVar52._60_4_ = (uint)(bVar10 >> 7) * auVar44._60_4_;
              auVar44 = vsubps_avx512f(auVar48,auVar49);
              auVar45 = vaddps_avx512f(auVar49,auVar48);
              vscatterdps_avx512f(ZEXT864(pfVar11) + _DAT_00109240,uVar16,auVar39);
              auVar39 = vaddps_avx512f(auVar50,auVar38);
              auVar38 = vsubps_avx512f(auVar38,auVar50);
              vscatterdps_avx512f(ZEXT864(pfVar11) + auVar42,uVar16,auVar44);
              vscatterdps_avx512f(ZEXT864(pfVar11) + ZEXT864(0x10) + _DAT_00109240,uVar16,auVar42);
              auVar44 = vsubps_avx512f(auVar51,auVar52);
              auVar53 = vaddps_avx512f(auVar52,auVar51);
              vscatterdps_avx512f(ZEXT864(pfVar11) + ZEXT864(0x10) + auVar42,uVar16,auVar45);
              vscatterdps_avx512f(ZEXT864(pfVar11) + ZEXT864(0x20) + _DAT_00109240,uVar16,auVar39);
              vscatterdps_avx512f(ZEXT864(pfVar11) + ZEXT864(0x20) + auVar42,uVar16,auVar44);
              vscatterdps_avx512f(ZEXT864(pfVar11) + ZEXT864(0x30) + _DAT_00109240,uVar16,auVar38);
              vscatterdps_avx512f(ZEXT864(pfVar11) + ZEXT864(0x30) + auVar42,uVar16,auVar53);
              pfVar11 = pfVar11 + 0x100;
            } while ((((ulong)(1L << (uVar13 & 0x3f)) >> 3) + 0xf & 0xfffffffffffffff0) != uVar14);
            uVar14 = 4;
            goto LAB_00105e6e;
          }
LAB_00105e8f:
          bfstages(ioptr,uVar13,Utbl,2,uVar14,StageCnt);
        }
        else {
LAB_00105e6e:
          if (lVar12 == 2) {
            bfR4(ioptr,uVar13,uVar14);
            uVar14 = (ulong)(uint)((int)uVar14 << 2);
          }
          if (uVar13 < 0xc) goto LAB_00105e8f;
          fftrecurs(ioptr,uVar13,Utbl,2,uVar14,StageCnt);
        }
        frstage(ioptr,M,Utbl);
        ioptr = ioptr + (2L << (uVar13 & 0x3f));
        bVar1 = 1 < Rows;
        Rows = Rows + -1;
      } while (bVar1);
    }
  }
  return;
}

Assistant:

void rffts1(float *ioptr, long M, long Rows, float *Utbl, short *BRLow){
/* Compute in-place real fft on the rows of the input array	*/
/* The result is the complex spectra of the positive frequencies */
/* except the location for the first complex number contains the real */
/* values for DC and Nyquest */
/* INPUTS */
/* *ioptr = real input data array	*/
/* M = log2 of fft size	*/
/* Rows = number of rows in ioptr array (use Rows of 1 if ioptr is a 1 dimensional array)	*/
/* *Utbl = cosine table	*/
/* *BRLow = bit reversed counter table	*/
/* OUTPUTS */
/* *ioptr = output data array	in the following order */
/* Re(x[0]), Re(x[N/2]), Re(x[1]), Im(x[1]), Re(x[2]), Im(x[2]), ... Re(x[N/2-1]), Im(x[N/2-1]). */

float	scale;
long 	StageCnt;
long 	NDiffU;

M=M-1;
switch (M){
case -1:
	break;
case 0:
	for (;Rows>0;Rows--){
		rfft1pt(ioptr);				/* a 2 pt fft */
		ioptr += 2*POW2(M);
	}
case 1:
	for (;Rows>0;Rows--){
		rfft2pt(ioptr);				/* a 4 pt fft */
		ioptr += 2*POW2(M);
	}
	break;
case 2:
	for (;Rows>0;Rows--){
		rfft4pt(ioptr);				/* an 8 pt fft */
		ioptr += 2*POW2(M);
	}
	break;
case 3:
	for (;Rows>0;Rows--){
		rfft8pt(ioptr);				/* a 16 pt fft */
		ioptr += 2*POW2(M);
	}
	break;
default:
	scale = 0.5;
	for (;Rows>0;Rows--){

		scbitrevR2(ioptr, M, BRLow, scale);						/* bit reverse and first radix 2 stage */
		
		StageCnt = (M-1) / 3;		// number of radix 8 stages
		NDiffU = 2;				// one radix 2 stage already complete

		if ( (M-1-(StageCnt * 3)) == 1 ){
			bfR2(ioptr, M, NDiffU);			/* 1 radix 2 stage */
			NDiffU *= 2;
		}

		if ( (M-1-(StageCnt * 3)) == 2 ){
			bfR4(ioptr, M, NDiffU);			/* 1 radix 4 stage */
			NDiffU *= 4;
		}

		if (M <= MCACHE){
			bfstages(ioptr, M, Utbl, 2, NDiffU, StageCnt);		/*  RADIX 8 Stages	*/
			frstage(ioptr, M+1, Utbl);
		}

		else{
			fftrecurs(ioptr, M, Utbl, 2, NDiffU, StageCnt);		/*  RADIX 8 Stages	*/
			frstage(ioptr, M+1, Utbl);
		}

		ioptr += 2*POW2(M);
	}
}
}